

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.h
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
gmath::operator>>(basic_istream<char,_std::char_traits<char>_> *in,SVector<double,_6> *a)

{
  long lVar1;
  char c;
  
  std::operator>>(in,&c);
  if (c == '[') {
    lVar1 = 0;
    while ((lVar1 != 0x30 && (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0))) {
      std::istream::_M_extract<double>((double *)in);
      lVar1 = lVar1 + 8;
    }
    std::operator>>(in,&c);
    if (c == ']') {
      return in;
    }
  }
  std::ios::setstate((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  return in;
}

Assistant:

std::basic_istream<Ch, Tr> &operator>>(std::basic_istream<Ch, Tr> &in, SVector<T, n> &a)
{
  char c;

  in >> c;

  if (c == '[')
  {
    for (int i=0; i<n && in; i++)
    {
      in >> a[i];
    }

    in >> c;

    if (c != ']')
    {
      in.setstate(std::ios_base::failbit);
    }
  }
  else
  {
    in.setstate(std::ios_base::failbit);
  }

  return in;
}